

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O0

void mpz_sub(__mpz_struct *r,__mpz_struct *a,__mpz_struct *b)

{
  mp_size_t mVar1;
  int local_30;
  int local_28;
  mp_size_t rn;
  __mpz_struct *b_local;
  __mpz_struct *a_local;
  __mpz_struct *r_local;
  
  if ((a->_mp_size ^ b->_mp_size) < 0) {
    mVar1 = mpz_abs_add(r,a,b);
    local_28 = (int)mVar1;
  }
  else {
    mVar1 = mpz_abs_sub(r,a,b);
    local_28 = (int)mVar1;
  }
  if (a->_mp_size < 0) {
    local_30 = -local_28;
  }
  else {
    local_30 = local_28;
  }
  r->_mp_size = local_30;
  return;
}

Assistant:

void
mpz_sub (mpz_t r, const mpz_t a, const mpz_t b)
{
  mp_size_t rn;

  if ( (a->_mp_size ^ b->_mp_size) >= 0)
    rn = mpz_abs_sub (r, a, b);
  else
    rn = mpz_abs_add (r, a, b);

  r->_mp_size = a->_mp_size >= 0 ? rn : - rn;
}